

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.h
# Opt level: O0

void __thiscall test_host::~test_host(test_host *this)

{
  test_host *this_local;
  
  std::__cxx11::string::~string((string *)&this->exception_msg);
  std::__cxx11::string::~string((string *)&this->test_name);
  return;
}

Assistant:

test_host() :
        fixture(),
        test(nullptr),
        test_name(),
        exception_msg(),
        passed(false)
    {
    }